

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<26>::
Type<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (Type<26> *this,HEAD *head,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT)

{
  int in_EAX;
  
  Base::Base(&this->super_Base,head,MAT,0x1a);
  readSequence<njoy::ENDFtk::section::Type<26>::ReactionProduct,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&this->products_,(ENDFtk *)begin,end,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,0x1a,
             (head->super_StructureDivision).tail.fields._M_elems[2],
             (int)((_Head_base<4UL,_long,_false> *)
                  ((long)&(head->super_StructureDivision).base.fields.
                          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<2UL,_long,_long,_long,_long>.
                          super__Tuple_impl<3UL,_long,_long,_long> + 8))->_M_head_impl,in_EAX);
  BaseWithoutMT<njoy::ENDFtk::section::Base>::
  readSEND<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (begin,end,lineNumber,MAT,0x1a);
  return;
}

Assistant:

Type( HEAD& head,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber,
      int MAT )
  try:
    Base( head, MAT, 26 ),
    products_(
      readSequence< ReactionProduct >( begin, end, lineNumber,
                                       MAT, 26, head.MT(), head.N1() ) ) {
    readSEND(begin, end, lineNumber, MAT, 26 );
  } catch( std::exception& e ) {

    Log::info( "Trouble while reading section {} of File 26 of Material {}",
               head.MT(), MAT );
    throw e;
  }